

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBuiltin_db_total_records(jx9_context *pCtx,int argc,jx9_value **argv)

{
  anon_union_8_3_18420de5_for_x aVar1;
  jx9_user_func *pjVar2;
  uint uVar3;
  char *pcVar4;
  unqlite_col *puVar5;
  int iFlag;
  jx9_value *pObj;
  jx9_vm *pVm;
  int nByte;
  SyString sName;
  uint local_24;
  SyString local_20;
  
  if (argc < 1) {
    pjVar2 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar4 = "Missing collection name";
LAB_001181e1:
    jx9VmThrowError(pVm,&pjVar2->sName,1,pcVar4);
  }
  else {
    pcVar4 = jx9_value_to_string(*argv,(int *)&local_24);
    if ((int)local_24 < 1) {
      pjVar2 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar4 = "Invalid collection name";
      goto LAB_001181e1;
    }
    local_20.nByte = local_24;
    local_20.zString = pcVar4;
    puVar5 = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_20,iFlag);
    if (puVar5 != (unqlite_col *)0x0) {
      aVar1 = (anon_union_8_3_18420de5_for_x)puVar5->nTotRec;
      pObj = pCtx->pRet;
      jx9MemObjRelease(pObj);
      pObj->x = aVar1;
      uVar3 = 2;
      goto LAB_00118203;
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  uVar3 = 8;
LAB_00118203:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | uVar3;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_total_records(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		unqlite_int64 nRec;
		nRec = unqliteCollectionTotalRecords(pCol);
		jx9_result_int64(pCtx,nRec);
	}else{
		/* No such collection */
		jx9_result_bool(pCtx,0);
	}
	return JX9_OK;
}